

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleTabBar::text(QString *__return_storage_ptr__,QAccessibleTabBar *this,Text t)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  QTabBar *pQVar5;
  QTabBar *this_00;
  long in_FS_OFFSET;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (t == Accelerator) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar5 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_00 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    iVar4 = QTabBar::currentIndex(this_00);
    QTabBar::tabText(&local_48,pQVar5,iVar4);
    qt_accHotKey(__return_storage_ptr__,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar4 = ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      local_60.d.d = local_48.d.d;
joined_r0x0051534b:
      if (iVar4 == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (t != Name) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_005153a1;
    }
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar5 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    iVar4 = QTabBar::currentIndex(pQVar5);
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QTabBar::accessibleTabName(__return_storage_ptr__,pQVar5,iVar4);
    if ((__return_storage_ptr__->d).size == 0) {
      QTabBar::tabText(&local_60,pQVar5,iVar4);
      qt_accStripAmp(&local_48,&local_60);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_48.d.d;
      (__return_storage_ptr__->d).ptr = local_48.d.ptr;
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_48.d.size;
      local_48.d.d = (Data *)pQVar1;
      local_48.d.ptr = pcVar2;
      local_48.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar4 = ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x0051534b;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_005153a1:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTabBar::text(QAccessible::Text t) const
{
    if (t == QAccessible::Name) {
        const QTabBar *tBar = tabBar();
        int idx = tBar->currentIndex();
        QString str = tBar->accessibleTabName(idx);
        if (str.isEmpty())
            str = qt_accStripAmp(tBar->tabText(idx));
        return str;
    } else if (t == QAccessible::Accelerator) {
        return qt_accHotKey(tabBar()->tabText(tabBar()->currentIndex()));
    }
    return QString();
}